

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionRotation_setpoint.cpp
# Opt level: O3

void __thiscall
chrono::ChFunctionRotation_setpoint::ArchiveIN
          (ChFunctionRotation_setpoint *this,ChArchiveIn *marchive)

{
  ChFunctorArchiveInSpecific<chrono::ChQuaternion<double>_> specFuncA;
  eChSetpointMode_mapper mmapper;
  undefined **local_80;
  ChEnumMapper<chrono::ChFunctionRotation_setpoint::eChSetpointMode> *local_78;
  undefined1 local_70;
  ChEnumMapper<chrono::ChFunctionRotation_setpoint::eChSetpointMode> local_68;
  eChSetpointMode_mapper local_48;
  
  ChArchiveIn::VersionRead<chrono::ChFunctionRotation_setpoint>(marchive);
  ChFunctionRotation::ArchiveIN(&this->super_ChFunctionRotation,marchive);
  eChSetpointMode_mapper::eChSetpointMode_mapper(&local_48);
  eChSetpointMode_mapper::operator()(&local_68,&local_48,&this->mode);
  local_80 = (undefined **)0x965a63;
  local_70 = 0;
  local_78 = &local_68;
  (**(code **)(*(long *)marchive + 0x58))(marchive,&local_80);
  local_68.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)&PTR_GetValueAsInt_00b46de0
  ;
  if (local_68.enummap.
      super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChFunctionRotation_setpoint::eChSetpointMode>,_std::allocator<chrono::ChEnumNamePair<chrono::ChFunctionRotation_setpoint::eChSetpointMode>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.enummap.
               super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChFunctionRotation_setpoint::eChSetpointMode>,_std::allocator<chrono::ChEnumNamePair<chrono::ChFunctionRotation_setpoint::eChSetpointMode>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_78 = (ChEnumMapper<chrono::ChFunctionRotation_setpoint::eChSetpointMode> *)&this->Q;
  local_80 = &PTR__ChFunctorArchiveIn_00b03a08;
  local_68.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x9eb384;
  local_68.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChFunctionRotation_setpoint::eChSetpointMode>,_std::allocator<chrono::ChEnumNamePair<chrono::ChFunctionRotation_setpoint::eChSetpointMode>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  local_68.value_ptr = (eChSetpointMode *)&local_80;
  (**(code **)(*(long *)marchive + 0x60))(marchive);
  local_78 = (ChEnumMapper<chrono::ChFunctionRotation_setpoint::eChSetpointMode> *)&this->W;
  local_68.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x9ea403;
  local_68.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChFunctionRotation_setpoint::eChSetpointMode>,_std::allocator<chrono::ChEnumNamePair<chrono::ChFunctionRotation_setpoint::eChSetpointMode>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  local_80 = &PTR__ChFunctorArchiveIn_00b03258;
  local_68.value_ptr = (eChSetpointMode *)&local_80;
  (**(code **)(*(long *)marchive + 0x60))(marchive);
  local_78 = (ChEnumMapper<chrono::ChFunctionRotation_setpoint::eChSetpointMode> *)&this->A;
  local_80 = &PTR__ChFunctorArchiveIn_00b03258;
  local_68.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x965f60;
  local_68.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChFunctionRotation_setpoint::eChSetpointMode>,_std::allocator<chrono::ChEnumNamePair<chrono::ChFunctionRotation_setpoint::eChSetpointMode>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  local_68.value_ptr = (eChSetpointMode *)&local_80;
  (**(code **)(*(long *)marchive + 0x60))(marchive);
  local_48.super_ChEnumMapper<chrono::ChFunctionRotation_setpoint::eChSetpointMode>.
  super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)&PTR_GetValueAsInt_00b46de0;
  if (local_48.super_ChEnumMapper<chrono::ChFunctionRotation_setpoint::eChSetpointMode>.enummap.
      super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChFunctionRotation_setpoint::eChSetpointMode>,_std::allocator<chrono::ChEnumNamePair<chrono::ChFunctionRotation_setpoint::eChSetpointMode>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super_ChEnumMapper<chrono::ChFunctionRotation_setpoint::eChSetpointMode>.
               enummap.
               super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChFunctionRotation_setpoint::eChSetpointMode>,_std::allocator<chrono::ChEnumNamePair<chrono::ChFunctionRotation_setpoint::eChSetpointMode>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void ChFunctionRotation_setpoint::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChFunctionRotation_setpoint>();
    // deserialize parent class
    ChFunctionRotation::ArchiveIN(marchive);
    // deserialize all member data:
    eChSetpointMode_mapper mmapper;
    marchive >> CHNVP(mmapper(mode), "mode");
    marchive >> CHNVP(Q);
    marchive >> CHNVP(W);
    marchive >> CHNVP(A);
}